

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O3

void mob_death_log(CHAR_DATA *killer,CHAR_DATA *dead)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  FILE *__stream;
  char *pcVar5;
  char *pcVar6;
  
  bVar4 = is_npc(killer);
  if (bVar4) {
    bVar4 = is_npc(dead);
    if (!bVar4) {
      bVar4 = is_explore(killer->in_room);
      if (bVar4) {
        __stream = fopen("../logs/mobdeaths.txt","a");
        if (__stream != (FILE *)0x0) {
          pcVar1 = dead->true_name;
          pcVar2 = killer->short_descr;
          pcVar3 = killer->in_room->area->name;
          pcVar5 = get_room_name(killer->in_room);
          pcVar6 = ctime(&current_time);
          fprintf(__stream,"%s | %s | %s | %s | %s",pcVar1,pcVar2,pcVar3,pcVar5,pcVar6);
          fclose(__stream);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void mob_death_log(CHAR_DATA *killer, CHAR_DATA *dead)
{
	if (!is_npc(killer) || is_npc(dead) || !is_explore(killer->in_room))
		return;

	auto fp = fopen(MOB_LOG_FILE, "a");
	if (fp == nullptr)
		return;

	fprintf(fp, "%s | %s | %s | %s | %s",
			dead->true_name,
			killer->short_descr,
			killer->in_room->area->name,
			get_room_name(killer->in_room),
			ctime(&current_time));

	fclose(fp);
}